

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

int __thiscall mp::Error::init(Error *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint64_t in_RCX;
  CStringRef in_RDX;
  anon_union_8_2_de49483c_for_ArgList_1 in_R8;
  ArgList args;
  string local_30;
  
  args.field_1.args_ = in_R8.args_;
  args.types_ = in_RCX;
  fmt::format_abi_cxx11_(&local_30,(fmt *)ctx,in_RDX,args);
  SetMessage(this,&local_30);
  iVar1 = std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

void init(fmt::CStringRef format_str, fmt::ArgList args) {
    SetMessage(fmt::format(format_str, args));
  }